

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFilter.cpp
# Opt level: O0

SimpleString __thiscall TestFilter::asString(TestFilter *this)

{
  char *pcVar1;
  SimpleString *in_RSI;
  char *in_RDI;
  SimpleString *textFilter;
  char *in_stack_ffffffffffffffd8;
  SimpleString *in_stack_ffffffffffffffe0;
  
  pcVar1 = SimpleString::asCharString(in_RSI);
  StringFromFormat(in_RDI,"TestFilter: \"%s\"",pcVar1);
  if ((((ulong)in_RSI[1].buffer_ & 1) == 0) || (((ulong)in_RSI[1].buffer_ & 0x100) == 0)) {
    if (((ulong)in_RSI[1].buffer_ & 1) == 0) {
      if (((ulong)in_RSI[1].buffer_ & 0x100) != 0) {
        SimpleString::operator+=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      }
    }
    else {
      SimpleString::operator+=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
  }
  else {
    SimpleString::operator+=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  return (SimpleString)in_RDI;
}

Assistant:

SimpleString TestFilter::asString() const
{
    SimpleString textFilter =  StringFromFormat("TestFilter: \"%s\"", filter_.asCharString());
    if (strictMatching_ && invertMatching_)
        textFilter += " with strict, invert matching";
    else if (strictMatching_)
        textFilter += " with strict matching";
    else if (invertMatching_)
        textFilter += " with invert matching";

    return textFilter;
}